

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O0

void __thiscall SerialTaskRunner::flush(SerialTaskRunner *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  AnnotatedMixin<std::mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_00000008;
  bool should_continue;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  SerialTaskRunner *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  bVar1 = CScheduler::AreThreadsServicingQueue
                    ((CScheduler *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_scheduler.AreThreadsServicingQueue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
                  ,0xbb,"virtual void SerialTaskRunner::flush()");
  }
  bVar2 = 1;
  while ((bVar2 & 1) != 0) {
    ProcessQueue(in_stack_fffffffffffffff0);
    MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffffc8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_00000008,unaff_retaddr,pszName,(char *)in_stack_fffffffffffffff0,
               in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
    bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            empty(in_stack_ffffffffffffffc8);
    bVar2 = (bVar1 ^ 0xffU) & 1;
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffc8);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::flush()
{
    assert(!m_scheduler.AreThreadsServicingQueue());
    bool should_continue = true;
    while (should_continue) {
        ProcessQueue();
        LOCK(m_callbacks_mutex);
        should_continue = !m_callbacks_pending.empty();
    }
}